

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O2

CURLcode rtsp_filter_rtp(Curl_easy *data,char *buf,size_t blen,size_t *pconsumed)

{
  anon_union_280_10_9f9d5394_for_proto *s;
  byte *pbVar1;
  byte *__s1;
  byte bVar2;
  connectdata *pcVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  size_t sVar8;
  char *pcVar9;
  long lVar10;
  size_t sVar11;
  ulong __n;
  curl_write_callback p_Var12;
  char *fmt;
  ulong uVar13;
  size_t local_60;
  
  pcVar3 = data->conn;
  s = &pcVar3->proto;
  *pconsumed = 0;
  local_60 = 0;
LAB_00148d95:
  if (blen == 0) {
LAB_001491b3:
    if (local_60 != 0) {
      CVar7 = rtp_write_body_junk(data,(char *)((byte *)buf + -local_60),local_60);
      return CVar7;
    }
    return CURLE_OK;
  }
  bVar5 = true;
  if ((((data->req).headerline != 0) && ((*(byte *)((long)&pcVar3->proto + 0x34) & 1) == 0)) &&
     (lVar10 = (data->req).size, -1 < lVar10)) {
    bVar5 = lVar10 <= (data->req).bytecount;
  }
  switch((pcVar3->proto).rtspc.state) {
  case RTP_PARSE_SKIP:
    sVar8 = local_60 + blen;
    pbVar1 = (byte *)buf + blen;
    lVar10 = 0;
    for (uVar13 = 0; blen != uVar13; uVar13 = uVar13 + 1) {
      __s1 = (byte *)buf + uVar13;
      if (*__s1 == 0x24) {
        local_60 = local_60 + uVar13;
        if ((local_60 != 0) &&
           (CVar7 = rtp_write_body_junk(data,(char *)((byte *)buf + uVar13 + -local_60),local_60),
           CVar7 != CURLE_OK)) {
          return CVar7;
        }
        CVar7 = Curl_dyn_addn((dynbuf *)&s->ftpc,(byte *)buf + uVar13,1);
        if (CVar7 != CURLE_OK) {
          return CURLE_OUT_OF_MEMORY;
        }
        *pconsumed = *pconsumed + 1;
        blen = blen + ~uVar13;
        (pcVar3->proto).rtspc.state = RTP_PARSE_CHANNEL;
        local_60 = 0;
        buf = (char *)((byte *)buf + uVar13 + 1);
        goto LAB_00148d95;
      }
      if ((!(bool)(*__s1 != 0x52 | bVar5 ^ 1U)) && ((data->set).rtspreq != RTSPREQ_RECEIVE)) {
        __n = lVar10 + blen;
        if (4 < lVar10 + blen) {
          __n = 5;
        }
        iVar6 = strncmp((char *)__s1,"RTSP/",__n);
        if (iVar6 == 0) {
          (pcVar3->proto).rtspc.state = RTP_PARSE_SKIP;
          pbVar1 = (byte *)((long)&pcVar3->proto + 0x34);
          *pbVar1 = *pbVar1 | 1;
          local_60 = local_60 + uVar13;
          buf = (char *)__s1;
          goto LAB_001491b3;
        }
      }
      *pconsumed = *pconsumed + 1;
      lVar10 = lVar10 + -1;
    }
    blen = 0;
    buf = (char *)pbVar1;
    local_60 = sVar8;
    goto LAB_00148d95;
  case RTP_PARSE_CHANNEL:
    bVar2 = *buf;
    if (((data->state).rtp_channel_mask[bVar2 >> 3] >> (bVar2 & 7) & 1) == 0) {
      (pcVar3->proto).rtspc.state = RTP_PARSE_SKIP;
      sVar8 = 1;
      if (*pconsumed == 0) {
        pcVar9 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
        CVar7 = rtp_write_body_junk(data,pcVar9,1);
        sVar8 = local_60;
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
      }
      Curl_dyn_free((dynbuf *)&s->ftpc);
      local_60 = sVar8;
      goto LAB_00148d95;
    }
    *(uint *)((long)&pcVar3->proto + 0x20) = (uint)bVar2;
    CVar7 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,1);
    if (CVar7 == CURLE_OK) {
      *pconsumed = *pconsumed + 1;
      blen = blen - 1;
      (pcVar3->proto).rtspc.state = RTP_PARSE_LEN;
      buf = (char *)((byte *)buf + 1);
      goto LAB_00148d95;
    }
    break;
  case RTP_PARSE_LEN:
    sVar8 = Curl_dyn_len((dynbuf *)&s->ftpc);
    CVar7 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,1);
    if (CVar7 == CURLE_OK) {
      *pconsumed = *pconsumed + 1;
      buf = (char *)((byte *)buf + 1);
      blen = blen - 1;
      if (sVar8 != 2) {
        pcVar9 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
        (pcVar3->proto).ftpc.pp.response.tv_sec =
             (ulong)(ushort)(*(ushort *)(pcVar9 + 2) << 8 | *(ushort *)(pcVar9 + 2) >> 8) + 4;
        (pcVar3->proto).rtspc.state = RTP_PARSE_DATA;
      }
      goto LAB_00148d95;
    }
    break;
  case RTP_PARSE_DATA:
    sVar8 = Curl_dyn_len((dynbuf *)&s->ftpc);
    uVar13 = (pcVar3->proto).ftpc.pp.response.tv_sec - sVar8;
    if (blen < uVar13) {
      CVar7 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,blen);
      if (CVar7 != CURLE_OK) {
        return CURLE_OUT_OF_MEMORY;
      }
      *pconsumed = *pconsumed + blen;
      buf = (char *)((byte *)buf + blen);
      blen = 0;
    }
    else {
      CVar7 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,uVar13);
      if (CVar7 != CURLE_OK) {
        return CURLE_OUT_OF_MEMORY;
      }
      *pconsumed = *pconsumed + uVar13;
      pcVar9 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
      sVar8 = (pcVar3->proto).ftpc.pp.response.tv_sec;
      fmt = "Cannot write a 0 size RTP packet.";
      if (sVar8 == 0) {
LAB_001490f6:
        bVar5 = false;
        Curl_failf(data,fmt);
        CVar7 = CURLE_WRITE_ERROR;
      }
      else {
        p_Var12 = (data->set).fwrite_rtp;
        lVar10 = 0x9f0;
        if (p_Var12 == (curl_write_callback)0x0) {
          p_Var12 = (data->set).fwrite_func;
          lVar10 = 0x1e8;
        }
        pvVar4 = *(void **)((long)&data->magic + lVar10);
        Curl_set_in_callback(data,true);
        sVar11 = (*p_Var12)(pcVar9,1,sVar8,pvVar4);
        Curl_set_in_callback(data,false);
        fmt = "Cannot pause RTP";
        if ((sVar11 == 0x10000001) || (fmt = "Failed writing RTP data", sVar11 != sVar8))
        goto LAB_001490f6;
        CVar7 = CURLE_OK;
        bVar5 = true;
      }
      Curl_dyn_free((dynbuf *)&s->ftpc);
      (pcVar3->proto).rtspc.state = RTP_PARSE_SKIP;
      blen = blen - uVar13;
      buf = (char *)((byte *)buf + uVar13);
      if (!bVar5) {
        return CVar7;
      }
    }
    goto LAB_00148d95;
  default:
    return CURLE_RECV_ERROR;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

static CURLcode rtsp_filter_rtp(struct Curl_easy *data,
                                     const char *buf,
                                     size_t blen,
                                     size_t *pconsumed)
{
  struct rtsp_conn *rtspc = &(data->conn->proto.rtspc);
  CURLcode result = CURLE_OK;
  size_t skip_len = 0;

  *pconsumed = 0;
  while(blen) {
    bool in_body = (data->req.headerline && !rtspc->in_header) &&
                   (data->req.size >= 0) &&
                   (data->req.bytecount < data->req.size);
    switch(rtspc->state) {

    case RTP_PARSE_SKIP: {
      DEBUGASSERT(Curl_dyn_len(&rtspc->buf) == 0);
      while(blen && buf[0] != '$') {
        if(!in_body && buf[0] == 'R' &&
           data->set.rtspreq != RTSPREQ_RECEIVE) {
          if(strncmp(buf, "RTSP/", (blen < 5) ? blen : 5) == 0) {
            /* This could be the next response, no consume and return */
            if(*pconsumed) {
              DEBUGF(infof(data, "RTP rtsp_filter_rtp[SKIP] RTSP/ prefix, "
                           "skipping %zd bytes of junk", *pconsumed));
            }
            rtspc->state = RTP_PARSE_SKIP;
            rtspc->in_header = TRUE;
            goto out;
          }
        }
        /* junk/BODY, consume without buffering */
        *pconsumed += 1;
        ++buf;
        --blen;
        ++skip_len;
      }
      if(blen && buf[0] == '$') {
        /* possible start of an RTP message, buffer */
        if(skip_len) {
          /* end of junk/BODY bytes, flush */
          result = rtp_write_body_junk(data,
                                       (char *)(buf - skip_len), skip_len);
          skip_len = 0;
          if(result)
            goto out;
        }
        if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += 1;
        ++buf;
        --blen;
        rtspc->state = RTP_PARSE_CHANNEL;
      }
      break;
    }

    case RTP_PARSE_CHANNEL: {
      int idx = ((unsigned char)buf[0]) / 8;
      int off = ((unsigned char)buf[0]) % 8;
      DEBUGASSERT(Curl_dyn_len(&rtspc->buf) == 1);
      if(!(data->state.rtp_channel_mask[idx] & (1 << off))) {
        /* invalid channel number, junk or BODY data */
        rtspc->state = RTP_PARSE_SKIP;
        DEBUGASSERT(skip_len == 0);
        /* we do not consume this byte, it is BODY data */
        DEBUGF(infof(data, "RTSP: invalid RTP channel %d, skipping", idx));
        if(*pconsumed == 0) {
          /* We did not consume the initial '$' in our buffer, but had
           * it from an earlier call. We cannot un-consume it and have
           * to write it directly as BODY data */
          result = rtp_write_body_junk(data, Curl_dyn_ptr(&rtspc->buf), 1);
          if(result)
            goto out;
        }
        else {
          /* count the '$' as skip and continue */
          skip_len = 1;
        }
        Curl_dyn_free(&rtspc->buf);
        break;
      }
      /* a valid channel, so we expect this to be a real RTP message */
      rtspc->rtp_channel = (unsigned char)buf[0];
      if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
      *pconsumed += 1;
      ++buf;
      --blen;
      rtspc->state = RTP_PARSE_LEN;
      break;
    }

    case RTP_PARSE_LEN: {
      size_t rtp_len = Curl_dyn_len(&rtspc->buf);
      const char *rtp_buf;
      DEBUGASSERT(rtp_len >= 2 && rtp_len < 4);
      if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
      *pconsumed += 1;
      ++buf;
      --blen;
      if(rtp_len == 2)
        break;
      rtp_buf = Curl_dyn_ptr(&rtspc->buf);
      rtspc->rtp_len = RTP_PKT_LENGTH(rtp_buf) + 4;
      rtspc->state = RTP_PARSE_DATA;
      break;
    }

    case RTP_PARSE_DATA: {
      size_t rtp_len = Curl_dyn_len(&rtspc->buf);
      size_t needed;
      DEBUGASSERT(rtp_len < rtspc->rtp_len);
      needed = rtspc->rtp_len - rtp_len;
      if(needed <= blen) {
        if(Curl_dyn_addn(&rtspc->buf, buf, needed)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += needed;
        buf += needed;
        blen -= needed;
        /* complete RTP message in buffer */
        DEBUGF(infof(data, "RTP write channel %d rtp_len %zu",
                     rtspc->rtp_channel, rtspc->rtp_len));
        result = rtp_client_write(data, Curl_dyn_ptr(&rtspc->buf),
                                  rtspc->rtp_len);
        Curl_dyn_free(&rtspc->buf);
        rtspc->state = RTP_PARSE_SKIP;
        if(result)
          goto out;
      }
      else {
        if(Curl_dyn_addn(&rtspc->buf, buf, blen)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += blen;
        buf += blen;
        blen = 0;
      }
      break;
    }

    default:
      DEBUGASSERT(0);
      return CURLE_RECV_ERROR;
    }
  }
out:
  if(!result && skip_len)
    result = rtp_write_body_junk(data, (char *)(buf - skip_len), skip_len);
  return result;
}